

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_after_finish_test(bool run)

{
  Color CVar1;
  bool bVar2;
  Offset<MyGame::Example::Monster> root;
  SizeT val;
  SizeT SVar3;
  string local_180;
  string local_160;
  SizeT local_13c;
  offset_type local_138;
  SizeT size2;
  undefined1 local_130 [4];
  Offset<MyGame::Example::Monster> root_offset2;
  TestHeapBuilder dst;
  SizeT size1;
  undefined1 local_90 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  TestHeapBuilder src;
  bool run_local;
  
  if (run) {
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_90);
    root = populate1((FlatBufferBuilder *)local_90);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)local_90,root,(char *)0x0);
    val = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)local_90);
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)local_130);
    local_138 = (offset_type)populate2((FlatBufferBuilder *)local_130);
    size2 = local_138;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)local_130,(Offset<MyGame::Example::Monster>)local_138
               ,(char *)0x0);
    local_13c = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                          ((FlatBufferBuilderImpl<false> *)local_130);
    flatbuffers::FlatBufferBuilderImpl<false>::Swap
              ((FlatBufferBuilderImpl<false> *)local_90,(FlatBufferBuilderImpl<false> *)local_130);
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)local_90);
    TestEq<unsigned_int,unsigned_int>
              (SVar3,local_13c,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                      ((FlatBufferBuilderImpl<false> *)local_130);
    TestEq<unsigned_int,unsigned_int>
              (SVar3,val,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    m2_name_abi_cxx11_();
    CVar1 = m2_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)local_90,&local_160,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_160);
    m1_name_abi_cxx11_();
    CVar1 = m1_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)local_130,&local_180,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_180);
    TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_130);
    TestHeapBuilder::~TestHeapBuilder((TestHeapBuilder *)local_90);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }